

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

QString * __thiscall
QDomElementPrivate::text(QString *__return_storage_ptr__,QDomElementPrivate *this)

{
  QDomElementPrivate *this_00;
  int iVar1;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = L"";
  (__return_storage_ptr__->d).size = 0;
  this_00 = (QDomElementPrivate *)(this->super_QDomNodePrivate).first;
  do {
    if (this_00 == (QDomElementPrivate *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    iVar1 = (*(this_00->super_QDomNodePrivate)._vptr_QDomNodePrivate[0xb])(this_00);
    if ((iVar1 - 3U < 2) ||
       (iVar1 = (*(this_00->super_QDomNodePrivate)._vptr_QDomNodePrivate[0xb])(this_00), iVar1 == 4)
       ) {
      local_38.d.d = (this_00->super_QDomNodePrivate).value.d.d;
      local_38.d.ptr = (this_00->super_QDomNodePrivate).value.d.ptr;
      local_38.d.size = (this_00->super_QDomNodePrivate).value.d.size;
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_38.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_38.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
LAB_00113806:
      QString::append(__return_storage_ptr__);
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      iVar1 = (*(this_00->super_QDomNodePrivate)._vptr_QDomNodePrivate[0xb])(this_00);
      if (iVar1 == 1) {
        text(&local_38,this_00);
        goto LAB_00113806;
      }
    }
    this_00 = (QDomElementPrivate *)(this_00->super_QDomNodePrivate).next;
  } while( true );
}

Assistant:

QString QDomElementPrivate::text()
{
    QString t(u""_s);

    QDomNodePrivate* p = first;
    while (p) {
        if (p->isText() || p->isCDATASection())
            t += p->nodeValue();
        else if (p->isElement())
            t += static_cast<QDomElementPrivate *>(p)->text();
        p = p->next;
    }

    return t;
}